

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q3b_kheap_height.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t n;
  uint64_t k;
  ulong local_20;
  long local_18;
  
  piVar1 = std::istream::_M_extract<unsigned_long>(&std::cin);
  std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
  if (local_18 != 1) {
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < local_20;
        uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3) {
      auVar6._8_4_ = (int)((ulong)local_18 >> 0x20);
      auVar6._0_8_ = local_18;
      auVar6._12_4_ = 0x45300000;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      dVar5 = pow((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0),
                  (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      auVar7._8_4_ = (int)(uVar3 >> 0x20);
      auVar7._0_8_ = uVar3;
      auVar7._12_4_ = 0x45300000;
      dVar5 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0) + dVar5;
      uVar3 = (ulong)dVar5;
      lVar4 = lVar4 + 1;
    }
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar2,"\n");
  return 0;
}

Assistant:

int main() {
    uint64_t n, k, s, f;
    cin >> n >> k;
    if (k == 1)
        cout << n - k << "\n";
    else {
        s = 0;
        f = 0;
        while (s < n) {
            s += pow(k, f++);
        }
        cout << f - 1 << "\n";
    }
}